

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

QByteArray * __thiscall
QProcess::readAllStandardError(QByteArray *__return_storage_ptr__,QProcess *this)

{
  int channel;
  QObjectData *pQVar1;
  Data *pDVar2;
  QProcessPrivate *d;
  long in_FS_OFFSET;
  QMessageLogger local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(char *)((long)&pQVar1[8].children.d.ptr + 7) == '\x01') {
    local_48.context.version = 2;
    local_48.context.line = 0;
    local_48.context.file._0_4_ = 0;
    local_48.context.file._4_4_ = 0;
    local_48.context.function._0_4_ = 0;
    local_48.context.function._4_4_ = 0;
    local_48.context.category = "default";
    QMessageLogger::warning(&local_48,"QProcess::readAllStandardError: Called with MergedChannels");
  }
  else {
    channel = *(int *)&pQVar1[2].parent;
    QIODevice::setCurrentReadChannel(&this->super_QIODevice,1);
    QIODevice::readAll((QByteArray *)&local_48,&this->super_QIODevice);
    pDVar2 = (Data *)CONCAT44(local_48.context.line,local_48.context.version);
    local_48.context.version = 0;
    local_48.context.line = 0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr =
         (char *)CONCAT44(local_48.context.file._4_4_,local_48.context.file._0_4_);
    local_48.context.file._0_4_ = 0;
    local_48.context.file._4_4_ = 0;
    (__return_storage_ptr__->d).size =
         CONCAT44(local_48.context.function._4_4_,local_48.context.function._0_4_);
    QIODevice::setCurrentReadChannel(&this->super_QIODevice,channel);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QProcess::readAllStandardError()
{
    Q_D(QProcess);
    QByteArray data;
    if (d->processChannelMode == MergedChannels) {
        qWarning("QProcess::readAllStandardError: Called with MergedChannels");
    } else {
        ProcessChannel tmp = readChannel();
        setReadChannel(StandardError);
        data = readAll();
        setReadChannel(tmp);
    }
    return data;
}